

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O0

ssize_t __thiscall
libnbt::NBTTagCompound::write(NBTTagCompound *this,int __fd,void *__buf,size_t __n)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  pointer ppVar4;
  long lVar5;
  undefined4 in_register_00000034;
  undefined2 local_32;
  NBTBase *pNStack_30;
  int16_t size;
  NBTBase *nbt;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_true>
  local_20;
  iterator i;
  ostream *out_local;
  NBTTagCompound *this_local;
  
  i.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_true>
  ._M_cur._4_4_ = in_register_00000034;
  i.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_true>
  ._M_cur._0_4_ = __fd;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>_>_>
       ::begin(&this->map);
  while( true ) {
    nbt = (NBTBase *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>_>_>
          ::end(&this->map);
    bVar2 = std::__detail::operator!=
                      (&local_20,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_true>
                        *)&nbt);
    if (!bVar2) break;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_false,_true>
                           *)&local_20);
    iVar1 = i;
    pNStack_30 = ppVar4->second;
    (*pNStack_30->_vptr_NBTBase[2])();
    std::ostream::put((char)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_true>
                            ._M_cur);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_false,_true>
                  *)&local_20);
    local_32 = std::__cxx11::string::size();
    writeBytes((ostream *)
               i.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_true>
               ._M_cur,(char *)&local_32,'\x02');
    iVar1 = i;
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_false,_true>
                  *)&local_20);
    lVar5 = std::__cxx11::string::c_str();
    std::ostream::write((char *)iVar1.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_true>
                                ._M_cur,lVar5);
    (*pNStack_30->_vptr_NBTBase[1])();
    iVar3 = (*pNStack_30->_vptr_NBTBase[2])();
    if ((char)iVar3 == '\n') {
      std::ostream::put((char)i.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_true>
                              ._M_cur);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libnbt::NBTBase_*>,_false,_true>
                  *)&local_20,0);
  }
  return CONCAT71(extraout_var,bVar2);
}

Assistant:

void NBTTagCompound::write(std::ostream &out) {
        auto i = map.begin();
        for (; i != map.end(); i++) {
            auto *nbt = i->second;
            out.put(nbt->getType());
            auto size = (int16_t) i->first.size();
            writeBytes(out, (char *) &size, 2);
            out.write(i->first.c_str(), size);
            nbt->write(out);
            if (nbt->getType() == COMPOUND) {
                out.put(END);
            }
        }
    }